

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_bin_flush_stashed
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,_Bool is_small)

{
  uint64_t *puVar1;
  size_t *psVar2;
  ticker_geom_t *ptVar3;
  witness_t **ppwVar4;
  ulong *puVar5;
  locked_u64_t *plVar6;
  char cVar7;
  ushort uVar8;
  undefined2 uVar9;
  edata_t *peVar10;
  uint64_t uVar11;
  emap_batch_lookup_result_t eVar12;
  void *pvVar13;
  edata_t *peVar14;
  undefined8 uVar15;
  cache_bin_t *pcVar16;
  malloc_mutex_t *pmVar17;
  szind_t sVar18;
  void **ppvVar19;
  tsd_t *ptVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  size_t sVar24;
  emap_batch_lookup_result_t *peVar25;
  size_t sVar26;
  ulong extraout_RAX;
  bin_t *pbVar27;
  uint uVar28;
  pthread_mutex_t *ppVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  uint src_ind;
  uint uVar32;
  ulong uVar33;
  arena_t *paVar34;
  edata_t *peVar35;
  ushort uVar36;
  bin_t *pbVar37;
  undefined7 in_register_00000081;
  pthread_mutex_t *ppVar38;
  long lVar39;
  uint uVar40;
  long *plVar41;
  long lVar42;
  cache_bin_t *pcVar43;
  uint i;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  szind_t sVar47;
  long local_228 [33];
  ulong local_120;
  undefined1 *local_118;
  tcache_t *local_110;
  void **local_108;
  uint32_t *local_100;
  bin_t *local_f8;
  long local_f0;
  uint local_e4;
  int local_e0;
  undefined4 local_dc;
  cache_bin_ptr_array_t local_d8;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8;
  ulong local_a0;
  pthread_mutex_t *local_98;
  cache_bin_t *local_90;
  size_t local_88;
  arena_t *local_80;
  uint local_74;
  arena_stats_large_t *local_70;
  arena_stats_large_t *lstats;
  edata_t *local_60;
  undefined8 *local_58;
  tsd_t *local_50;
  arena_t *local_48;
  szind_t local_3c;
  bin_t *local_38;
  mutex_prof_data_t *data;
  
  local_dc = (undefined4)CONCAT71(in_register_00000081,is_small);
  uVar8 = (cache_bin->bin_info).ncached_max;
  uVar36 = (uVar8 * 8 - (short)*(int *)&cache_bin->low_bits_empty) + cache_bin->low_bits_full;
  if (7 < uVar36) {
    uVar33 = (ulong)(uVar36 >> 3);
    ppVar38 = (pthread_mutex_t *)cache_bin->stack_head;
    local_108 = (void **)((long)ppVar38 +
                         (ulong)uVar8 * -8 +
                         (ulong)(*(int *)&cache_bin->low_bits_empty - (int)ppVar38 & 0xffff));
    uVar45 = (ulong)binind;
    local_110 = tcache;
    local_90 = cache_bin;
    duckdb_je_san_check_stashed_ptrs(local_108,uVar33,duckdb_je_sz_index2size_tab[uVar45]);
    local_f0 = uVar45 - 0x24;
    local_100 = &duckdb_je_bin_infos[uVar45].nregs;
    local_a8 = 0;
    local_118 = (undefined1 *)local_228;
    pcVar43 = local_90;
    local_c0 = uVar45;
    local_a0 = uVar33;
    local_50 = tsd;
    local_3c = binind;
    do {
      iVar46 = (int)local_a0;
      iVar21 = (int)local_a8;
      uVar32 = iVar46 - iVar21;
      if (0xff < (uint)(iVar46 - iVar21)) {
        uVar32 = 0x100;
      }
      lstats = (arena_stats_large_t *)(ulong)uVar32;
      local_d8.n = (cache_bin_sz_t)uVar32;
      local_d8.ptr = local_108 + local_a8;
      local_80 = local_110->tcache_slow->arena;
      if ((char)local_dc == '\0') {
        puVar30 = (undefined8 *)(local_118 + -((ulong)uVar32 * 8 + 0x17 & 0xfffffffffffffff0));
        local_58 = puVar30;
        puVar30[-1] = 0x11832b2;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_d8,uVar32,(size_t)puVar30,(emap_batch_lookup_result_t *)ppVar38);
        if (iVar46 != iVar21) {
          local_70 = (local_80->stats).lstats + local_f0;
          local_38 = (bin_t *)((ulong)local_38 & 0xffffffff00000000);
          uVar33 = (ulong)lstats & 0xffffffff;
          puVar31 = local_58;
          do {
            uVar32 = *(uint *)*puVar31 & 0xfff;
            paVar34 = (arena_t *)duckdb_je_arenas[uVar32].repr;
            if (paVar34 == (arena_t *)0x0) {
              paVar34 = (arena_t *)0x0;
            }
            if (duckdb_je_manual_arena_base <= paVar34->ind) {
              puVar30[-1] = 0x1183330;
              iVar21 = pthread_mutex_trylock
                                 ((pthread_mutex_t *)((long)&(paVar34->large_mtx).field_0 + 0x48));
              if (iVar21 != 0) {
                puVar30[-1] = 0x1183340;
                duckdb_je_malloc_mutex_lock_slow(&paVar34->large_mtx);
                (paVar34->large_mtx).field_0.field_0.locked.repr = true;
              }
              puVar1 = &(paVar34->large_mtx).field_0.field_0.prof_data.n_lock_ops;
              *puVar1 = *puVar1 + 1;
              puVar31 = local_58;
              if (&((paVar34->large_mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
                *(tsd_t **)((long)&(paVar34->large_mtx).field_0 + 0x30) = tsd;
                ppwVar4 = &(paVar34->large_mtx).field_0.witness.link.qre_prev;
                *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
              }
            }
            if ((local_80 == paVar34) && (((ulong)local_38 & 1) == 0)) {
              uVar11 = (local_90->tstats).nrequests;
              LOCK();
              (local_70->nrequests).val.repr = (local_70->nrequests).val.repr + uVar11;
              UNLOCK();
              LOCK();
              (local_70->nflushes).val.repr = (local_70->nflushes).val.repr + 1;
              UNLOCK();
              (local_90->tstats).nrequests = 0;
              local_38 = (bin_t *)CONCAT44(local_38._4_4_,(int)CONCAT71((int7)(uVar11 >> 8),1));
            }
            iVar21 = (int)uVar33;
            local_88 = CONCAT44(local_88._4_4_,iVar21);
            uVar45 = (ulong)(iVar21 + (uint)(iVar21 == 0));
            uVar33 = 0;
            local_48 = paVar34;
            do {
              peVar10 = (edata_t *)puVar31[uVar33];
              if (((uint)peVar10->e_bits & 0xfff) == uVar32) {
                puVar30[-1] = 0x11833c3;
                duckdb_je_large_dalloc_prep_locked((tsdn_t *)tsd,peVar10);
                puVar31 = local_58;
              }
              uVar33 = uVar33 + 1;
            } while (uVar45 != uVar33);
            if (duckdb_je_manual_arena_base <= local_48->ind) {
              (local_48->large_mtx).field_0.field_0.locked.repr = false;
              pmVar17 = &local_48->large_mtx;
              puVar30[-1] = 0x11833f7;
              pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar17->field_0 + 0x48));
              puVar31 = local_58;
            }
            ppvVar19 = local_d8.ptr;
            uVar44 = 0;
            uVar33 = 0;
            do {
              ptVar20 = local_50;
              peVar10 = (edata_t *)puVar31[uVar44];
              if (((uint)peVar10->e_bits & 0xfff) == uVar32) {
                puVar30[-1] = 0x1183423;
                duckdb_je_large_dalloc_finish((tsdn_t *)ptVar20,peVar10);
                puVar31 = local_58;
              }
              else {
                ppvVar19[uVar33] = ppvVar19[uVar44];
                puVar31[uVar33] = peVar10;
                uVar33 = (ulong)((int)uVar33 + 1);
              }
              paVar34 = local_48;
              tsd = local_50;
              uVar44 = uVar44 + 1;
            } while (uVar45 != uVar44);
            if (local_50 != (tsd_t *)0x0) {
              cVar7 = local_50->
                      cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
              ptVar3 = &local_50->
                        cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
              ptVar3->tick = ptVar3->tick + ((int)uVar33 - (int)local_88);
              if (ptVar3->tick < 0) {
                if (cVar7 < '\x01') {
                  uVar45 = local_50->
                           cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                           0x5851f42d4c957f2d + 0x14057b7ef767814f;
                  local_50->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state =
                       uVar45;
                  (local_50->
                  cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick =
                       (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar45 >> 0x3a] *
                                 (long)(local_50->
                                       cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                       ).nticks) / 0x3d);
                  puVar30[-1] = 0x11834f6;
                  duckdb_je_arena_decay((tsdn_t *)tsd,paVar34,false,false);
                  puVar31 = local_58;
                }
                else {
                  (local_50->
                  cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).tick = 0
                  ;
                }
              }
            }
          } while ((int)uVar33 != 0);
          iVar21 = (int)local_a8;
          pcVar43 = local_90;
          if (((ulong)local_38 & 1) != 0) goto LAB_011836aa;
        }
        LOCK();
        plVar6 = &(local_80->stats).lstats[local_f0].nrequests;
        (plVar6->val).repr = (plVar6->val).repr + (pcVar43->tstats).nrequests;
        UNLOCK();
        iVar21 = (int)local_a8;
        LOCK();
        plVar6 = &(local_80->stats).lstats[local_f0].nflushes;
        (plVar6->val).repr = (plVar6->val).repr + 1;
        UNLOCK();
        (pcVar43->tstats).nrequests = 0;
      }
      else {
        local_e4 = (uint)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).
                         binshard[local_c0];
        uVar33 = (ulong)uVar32 * 8 + 0x17 & 0xfffffffffffffff0;
        ppVar29 = (pthread_mutex_t *)(local_118 + -uVar33);
        local_98 = ppVar29;
        ((emap_batch_lookup_result_t *)((long)ppVar29 - 8))->edata = (edata_t *)0x1182bb1;
        tcache_bin_flush_edatas_lookup
                  (tsd,&local_d8,uVar32,(size_t)ppVar29,(emap_batch_lookup_result_t *)ppVar38);
        lVar23 = (long)ppVar29 - uVar33;
        if (iVar46 != iVar21) {
          local_e0 = (int)lstats + -1;
          local_b8 = 0;
          local_70 = (arena_stats_large_t *)((ulong)local_70 & 0xffffffff00000000);
          local_60 = (edata_t *)0x0;
          uVar32 = 0;
          sVar47 = local_3c;
          local_c8 = lVar23;
          do {
            sVar18 = duckdb_je_bin_info_nbatched_sizes;
            uVar33 = (ulong)uVar32;
            peVar10 = ((emap_batch_lookup_result_t *)((long)local_98 + uVar33 * 8))->edata;
            uVar22 = (uint)peVar10->e_bits;
            paVar34 = (arena_t *)duckdb_je_arenas[uVar22 & 0xfff].repr;
            if (paVar34 == (arena_t *)0x0) {
              paVar34 = (arena_t *)0x0;
            }
            uVar28 = (uint)(peVar10->e_bits >> 0x26) & 0x3f;
            pbVar37 = (bin_t *)((long)&paVar34->nthreads[(ulong)uVar28 * 0xa2].repr +
                               (ulong)duckdb_je_arena_bin_offsets[local_c0]);
            local_b0 = CONCAT44(local_b0._4_4_,duckdb_je_bin_info_nbatched_sizes);
            pbVar27 = (bin_t *)((long)&paVar34->nthreads[0].repr +
                               (ulong)(uVar28 << 8) + (ulong)duckdb_je_arena_bin_offsets[local_c0]);
            if (sVar47 < duckdb_je_bin_info_nbatched_sizes) {
              pbVar27 = pbVar37;
            }
            uVar40 = uVar32 + 1;
            if (uVar40 < (uint)lstats) {
              uVar45 = (ulong)uVar40;
              lVar39 = 0;
              do {
                peVar10 = *(edata_t **)((long)local_98 + lVar39 * 8 + uVar45 * 8);
                uVar11 = peVar10->e_bits;
                if ((((uVar22 ^ (uint)uVar11) & 0xfff) == 0) &&
                   (((uint)(uVar11 >> 0x26) & 0x3f) == uVar28)) {
                  uVar44 = (ulong)uVar40;
                  eVar12 = *(emap_batch_lookup_result_t *)((long)local_98 + uVar44 * 8);
                  ((emap_batch_lookup_result_t *)((long)local_98 + uVar44 * 8))->edata = peVar10;
                  *(emap_batch_lookup_result_t *)((long)local_98 + lVar39 * 8 + uVar45 * 8) = eVar12
                  ;
                  pvVar13 = local_d8.ptr[uVar44];
                  local_d8.ptr[uVar44] = local_d8.ptr[uVar45 + lVar39];
                  local_d8.ptr[uVar45 + lVar39] = pvVar13;
                  uVar40 = uVar40 + 1;
                }
                lVar39 = lVar39 + 1;
              } while (local_e0 - uVar32 != (int)lVar39);
            }
            local_88 = (size_t)(uVar40 - uVar32);
            local_120 = uVar33;
            local_f8 = pbVar37;
            local_48 = paVar34;
            local_38 = pbVar27;
            if ((uVar28 == local_e4 && paVar34 == local_80 || sVar18 <= sVar47) ||
                duckdb_je_opt_bin_info_remote_free_max_batch < local_88) {
LAB_0118313e:
              pbVar27 = local_38;
              tsd = local_50;
              *(undefined8 *)(lVar23 + -8) = 0x118315c;
              duckdb_je_tcache_bin_flush_stashed_cold_1();
              lVar39 = local_228[0];
              if ((extraout_RAX & 1) == 0) {
LAB_01182e08:
                plVar41 = (long *)((long)&(pbVar27->lock).field_0 + lVar39);
                *plVar41 = *plVar41 + 1;
              }
LAB_01182e0c:
              ppVar38 = local_98;
              ppvVar19 = local_d8.ptr;
              uVar33 = local_120;
              if ((local_48 == local_80) && ((local_b8 & 1) == 0)) {
                puVar1 = &(pbVar27->stats).nflushes;
                *puVar1 = *puVar1 + 1;
                uVar11 = (local_90->tstats).nrequests;
                puVar1 = &(pbVar27->stats).nrequests;
                *puVar1 = *puVar1 + uVar11;
                (local_90->tstats).nrequests = 0;
                local_b8 = CONCAT71((int7)(uVar11 >> 8),1);
              }
              local_58 = (undefined8 *)(ulong)duckdb_je_arena_binind_div_info[local_c0].magic;
              if (uVar32 < uVar40) {
                lVar39 = local_120 * 8;
                lVar42 = 0;
                paVar34 = local_48;
                local_74 = uVar40;
                do {
                  ptVar20 = local_50;
                  peVar10 = *(edata_t **)((long)ppVar38 + lVar42 * 8 + lVar39);
                  uVar45 = ((long)ppvVar19[uVar33 + lVar42] - (long)peVar10->e_addr) *
                           (long)local_58;
                  puVar5 = (ulong *)((long)&peVar10->field_6 + (uVar45 >> 0x26) * 8);
                  *puVar5 = *puVar5 ^ 1L << ((byte)(uVar45 >> 0x20) & 0x3f);
                  uVar45 = peVar10->e_bits + 0x10000000;
                  peVar10->e_bits = uVar45;
                  uVar22 = (uint)(uVar45 >> 0x1c) & 0x3ff;
                  if (uVar22 == *local_100) {
                    *(undefined8 *)(lVar23 + -8) = 0x1182eea;
                    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                              ((tsdn_t *)ptVar20,paVar34,peVar10,pbVar27);
                    pbVar27 = local_38;
                    paVar34 = local_48;
                    if ((uint)local_70 < (uint)lstats) {
                      *(edata_t **)(local_c8 + ((ulong)local_70 & 0xffffffff) * 8) = peVar10;
                      local_70 = (arena_stats_large_t *)CONCAT44(local_70._4_4_,(uint)local_70 + 1);
                      peVar35 = local_60;
                    }
                    else {
                      (peVar10->field_5).ql_link_active.qre_next = peVar10;
                      (peVar10->field_5).ql_link_active.qre_prev = peVar10;
                      peVar35 = peVar10;
                      if (local_60 != (edata_t *)0x0) {
                        (peVar10->field_5).ql_link_active.qre_next =
                             (local_60->field_5).ql_link_active.qre_prev;
                        (local_60->field_5).ql_link_active.qre_prev = peVar10;
                        (peVar10->field_5).ql_link_active.qre_prev =
                             (((peVar10->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                             qre_next;
                        (((local_60->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = local_60;
                        (((peVar10->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                        qre_next = peVar10;
                        peVar35 = (peVar10->field_5).ql_link_active.qre_next;
                      }
                    }
                  }
                  else {
                    peVar35 = local_60;
                    if ((uVar22 == 1) && (pbVar27->slabcur != peVar10)) {
                      *(undefined8 *)(lVar23 + -8) = 0x1182f25;
                      duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                                ((tsdn_t *)ptVar20,paVar34,peVar10,pbVar27);
                      paVar34 = local_48;
                      pbVar27 = local_38;
                      peVar35 = local_60;
                    }
                  }
                  local_60 = peVar35;
                  lVar42 = lVar42 + 1;
                } while ((int)local_88 != (int)lVar42);
                lVar39 = (ulong)(~uVar32 + uVar40) + 1;
                tsd = local_50;
                uVar32 = local_74;
              }
              else {
                lVar39 = 0;
                uVar32 = uVar40;
              }
              if (local_3c < (uint)local_b0) {
                pbVar37 = local_f8 + 1;
                *(undefined8 *)(lVar23 + -8) = 0x1182fc7;
                sVar24 = duckdb_je_batcher_pop_begin((tsdn_t *)tsd,(batcher_t *)pbVar37);
                pbVar27 = local_38;
                if (sVar24 != 0xffffffffffffffff) {
                  *(undefined8 *)(lVar23 + -8) = 0x1182fdf;
                  local_b0 = duckdb_je_batcher_pop_get_pushes((tsdn_t *)tsd,(batcher_t *)pbVar37);
                  pbVar27 = local_f8;
                  if (sVar24 == 0) {
                    *(undefined8 *)(lVar23 + -8) = 0x1183193;
                    batcher_pop_end((tsdn_t *)tsd,(batcher_t *)pbVar37);
                    pbVar27 = local_38;
                  }
                  else {
                    lVar42 = 0;
                    sVar26 = sVar24;
                    local_74 = uVar32;
                    do {
                      puVar30 = (undefined8 *)((long)&pbVar27[1].stats.curregs + lVar42);
                      uVar15 = puVar30[1];
                      *(undefined8 *)((long)local_228 + lVar42) = *puVar30;
                      *(undefined8 *)((long)local_228 + lVar42 + 8) = uVar15;
                      ptVar20 = local_50;
                      lVar42 = lVar42 + 0x10;
                      sVar26 = sVar26 - 1;
                    } while (sVar26 != 0);
                    *(undefined8 *)(lVar23 + -8) = 0x1183027;
                    batcher_pop_end((tsdn_t *)ptVar20,(batcher_t *)pbVar37);
                    plVar41 = local_228 + 1;
                    paVar34 = local_48;
                    pbVar27 = local_38;
                    sVar26 = sVar24;
                    do {
                      ptVar20 = local_50;
                      peVar10 = (edata_t *)*plVar41;
                      uVar33 = (plVar41[-1] - (long)peVar10->e_addr) * (long)local_58;
                      puVar5 = (ulong *)((long)&peVar10->field_6 + (uVar33 >> 0x26) * 8);
                      *puVar5 = *puVar5 ^ 1L << ((byte)(uVar33 >> 0x20) & 0x3f);
                      uVar33 = peVar10->e_bits + 0x10000000;
                      peVar10->e_bits = uVar33;
                      uVar32 = (uint)(uVar33 >> 0x1c) & 0x3ff;
                      if (uVar32 == *local_100) {
                        *(undefined8 *)(lVar23 + -8) = 0x1183094;
                        duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                                  ((tsdn_t *)ptVar20,paVar34,peVar10,pbVar27);
                        pbVar27 = local_38;
                        paVar34 = local_48;
                        if ((uint)local_70 < (uint)lstats) {
                          *(edata_t **)(local_c8 + ((ulong)local_70 & 0xffffffff) * 8) = peVar10;
                          local_70 = (arena_stats_large_t *)
                                     CONCAT44(local_70._4_4_,(uint)local_70 + 1);
                        }
                        else {
                          (peVar10->field_5).ql_link_active.qre_next = peVar10;
                          (peVar10->field_5).ql_link_active.qre_prev = peVar10;
                          if (local_60 == (edata_t *)0x0) {
                            local_60 = peVar10;
                          }
                          else {
                            (peVar10->field_5).ql_link_active.qre_next =
                                 (local_60->field_5).ql_link_active.qre_prev;
                            (local_60->field_5).ql_link_active.qre_prev = peVar10;
                            (peVar10->field_5).ql_link_active.qre_prev =
                                 (((peVar10->field_5).ql_link_active.qre_prev)->field_5).
                                 ql_link_active.qre_next;
                            (((local_60->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                            qre_next = local_60;
                            (((peVar10->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.
                            qre_next = peVar10;
                            local_60 = (peVar10->field_5).ql_link_active.qre_next;
                          }
                        }
                      }
                      else if ((uVar32 == 1) && (pbVar27->slabcur != peVar10)) {
                        *(undefined8 *)(lVar23 + -8) = 0x11830cf;
                        duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                                  ((tsdn_t *)ptVar20,paVar34,peVar10,pbVar27);
                        paVar34 = local_48;
                        pbVar27 = local_38;
                      }
                      plVar41 = plVar41 + 2;
                      sVar26 = sVar26 - 1;
                    } while (sVar26 != 0);
                    lVar39 = lVar39 + sVar24;
                    uVar32 = local_74;
                  }
                  puVar1 = &(pbVar27->stats).batch_pops;
                  *puVar1 = *puVar1 + 1;
                  puVar1 = &(pbVar27->stats).batch_pushes;
                  *puVar1 = *puVar1 + local_b0;
                  puVar1 = &(pbVar27->stats).batch_pushed_elems;
                  *puVar1 = *puVar1 + sVar24;
                  tsd = local_50;
                }
              }
              sVar47 = local_3c;
              puVar1 = &(pbVar27->stats).ndalloc;
              *puVar1 = *puVar1 + lVar39;
              psVar2 = &(pbVar27->stats).curregs;
              *psVar2 = *psVar2 - lVar39;
              (pbVar27->lock).field_0.field_0.locked.repr = false;
              ppVar38 = (pthread_mutex_t *)((long)&(pbVar27->lock).field_0 + 0x48);
              *(undefined8 *)(lVar23 + -8) = 0x11831d7;
              pthread_mutex_unlock(ppVar38);
            }
            else {
              *(undefined8 *)(lVar23 + -8) = 0x1182d65;
              iVar21 = pthread_mutex_trylock
                                 ((pthread_mutex_t *)((long)&(pbVar27->lock).field_0 + 0x48));
              ptVar20 = local_50;
              sVar24 = local_88;
              if (iVar21 == 0) {
                puVar1 = &(pbVar27->lock).field_0.field_0.prof_data.n_lock_ops;
                *puVar1 = *puVar1 + 1;
                tsd = local_50;
                if (&((pbVar27->lock).field_0.field_0.prof_data.prev_owner)->tsd != local_50) {
                  *(tsd_t **)((long)&(pbVar27->lock).field_0 + 0x30) = local_50;
                  lVar39 = 0x28;
                  goto LAB_01182e08;
                }
                goto LAB_01182e0c;
              }
              *(undefined8 *)(lVar23 + -8) = 0x1182d80;
              sVar24 = duckdb_je_batcher_push_begin
                                 ((tsdn_t *)ptVar20,(batcher_t *)(pbVar27 + 1),sVar24);
              tsd = local_50;
              ppVar38 = local_98;
              if (sVar24 == 0xffffffffffffffff) goto LAB_0118313e;
              if (uVar40 != uVar32) {
                peVar25 = (emap_batch_lookup_result_t *)(&local_38[1].stats.nfills + sVar24 * 2);
                sVar24 = local_88;
                do {
                  peVar25[-1] = *(emap_batch_lookup_result_t *)(local_d8.ptr + uVar32);
                  *peVar25 = *(emap_batch_lookup_result_t *)((long)local_98 + (ulong)uVar32 * 8);
                  uVar32 = uVar32 + 1;
                  peVar25 = peVar25 + 2;
                  sVar24 = sVar24 - 1;
                } while (sVar24 != 0);
              }
              *(undefined8 *)(lVar23 + -8) = 0x1182ddd;
              batcher_push_end((tsdn_t *)tsd,(batcher_t *)(pbVar27 + 1));
              sVar47 = local_3c;
              uVar32 = uVar40;
            }
            paVar34 = local_48;
            if (tsd != (tsd_t *)0x0) {
              cVar7 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
              ptVar3 = &tsd->
                        cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
              ptVar3->tick = ptVar3->tick - (int)local_88;
              if (ptVar3->tick < 0) {
                if (cVar7 < '\x01') {
                  uVar33 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                           0x5851f42d4c957f2d + 0x14057b7ef767814f;
                  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar33;
                  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
                  tick = (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar33 >> 0x3a] *
                                   (long)(tsd->
                                         cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                         ).nticks) / 0x3d);
                  *(undefined8 *)(lVar23 + -8) = 0x1183285;
                  duckdb_je_arena_decay((tsdn_t *)tsd,paVar34,false,false);
                }
                else {
                  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker).
                  tick = 0;
                }
              }
            }
            lVar39 = local_c8;
          } while (uVar32 < (uint)lstats);
          pcVar16 = local_90;
          peVar10 = local_60;
          if ((uint)local_70 != 0) {
            uVar33 = (ulong)local_70 & 0xffffffff;
            uVar45 = 0;
            do {
              peVar10 = *(edata_t **)(lVar39 + uVar45 * 8);
              paVar34 = (arena_t *)duckdb_je_arenas[(uint)peVar10->e_bits & 0xfff].repr;
              *(undefined8 *)(lVar23 + -8) = 0x1183535;
              duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar34,peVar10);
              uVar45 = uVar45 + 1;
              pcVar16 = local_90;
              peVar10 = local_60;
            } while (uVar33 != uVar45);
          }
          while (pcVar43 = local_90, peVar10 != (edata_t *)0x0) {
            peVar35 = (peVar10->field_5).ql_link_active.qre_next;
            if (peVar35 == peVar10) {
              peVar35 = (edata_t *)0x0;
            }
            else {
              (((peVar10->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                   (peVar35->field_5).ql_link_active.qre_prev;
              peVar14 = (peVar10->field_5).ql_link_active.qre_prev;
              (((peVar10->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
                   peVar14;
              (peVar10->field_5).ql_link_active.qre_prev =
                   (peVar14->field_5).ql_link_active.qre_next;
              peVar14 = (peVar10->field_5).ql_link_active.qre_next;
              (((peVar14->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                   peVar14;
              (((peVar10->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                   peVar10;
            }
            paVar34 = (arena_t *)duckdb_je_arenas[(uint)peVar10->e_bits & 0xfff].repr;
            local_90 = pcVar16;
            *(undefined8 *)(lVar23 + -8) = 0x11835ab;
            duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar34,peVar10);
            pcVar16 = local_90;
            peVar10 = peVar35;
            local_90 = pcVar43;
          }
          iVar21 = (int)local_a8;
          local_90 = pcVar16;
          if ((local_b8 & 1) != 0) goto LAB_011836aa;
        }
        sVar47 = local_3c;
        paVar34 = local_80;
        *(undefined8 *)(lVar23 + -8) = 0x11835df;
        pbVar27 = duckdb_je_arena_bin_choose((tsdn_t *)tsd,paVar34,sVar47,(uint *)0x0);
        ppVar29 = (pthread_mutex_t *)((long)&(pbVar27->lock).field_0 + 0x48);
        *(undefined8 *)(lVar23 + -8) = 0x11835f1;
        iVar21 = pthread_mutex_trylock(ppVar29);
        if (iVar21 != 0) {
          *(undefined8 *)(lVar23 + -8) = 0x11835fd;
          duckdb_je_malloc_mutex_lock_slow(&pbVar27->lock);
          (pbVar27->lock).field_0.field_0.locked.repr = true;
        }
        tsd = local_50;
        puVar1 = &(pbVar27->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if (&((pbVar27->lock).field_0.field_0.prof_data.prev_owner)->tsd != local_50) {
          *(tsd_t **)((long)&(pbVar27->lock).field_0 + 0x30) = local_50;
          ppwVar4 = &(pbVar27->lock).field_0.witness.link.qre_prev;
          *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
        }
        puVar1 = &(pbVar27->stats).nflushes;
        *puVar1 = *puVar1 + 1;
        puVar1 = &(pbVar27->stats).nrequests;
        *puVar1 = *puVar1 + (pcVar43->tstats).nrequests;
        (pcVar43->tstats).nrequests = 0;
        (pbVar27->lock).field_0.field_0.locked.repr = false;
        *(undefined8 *)(lVar23 + -8) = 0x118363d;
        pthread_mutex_unlock(ppVar29);
        iVar21 = (int)local_a8;
      }
LAB_011836aa:
      local_a8 = (ulong)(iVar21 + (uint)lstats);
    } while (iVar21 + (uint)lstats < (uint)local_a0);
    uVar9 = pcVar43->low_bits_empty;
    pcVar43->low_bits_full = uVar9 + (pcVar43->bin_info).ncached_max * -8;
  }
  return;
}

Assistant:

void
tcache_bin_flush_stashed(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, bool is_small) {
	assert(!tcache_bin_disabled(binind, cache_bin, tcache->tcache_slow));
	/*
	 * The two below are for assertion only.  The content of original cached
	 * items remain unchanged -- the stashed items reside on the other end
	 * of the stack.  Checking the stack head and ncached to verify.
	 */
	void *head_content = *cache_bin->stack_head;
	cache_bin_sz_t orig_cached = cache_bin_ncached_get_local(cache_bin);

	cache_bin_sz_t nstashed = cache_bin_nstashed_get_local(cache_bin);
	assert(orig_cached + nstashed <= cache_bin_ncached_max_get(cache_bin));
	if (nstashed == 0) {
		return;
	}

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nstashed);
	cache_bin_init_ptr_array_for_stashed(cache_bin, binind, &ptrs,
	    nstashed);
	san_check_stashed_ptrs(ptrs.ptr, nstashed, sz_index2size(binind));
	tcache_bin_flush_impl(tsd, tcache, cache_bin, binind, &ptrs, nstashed,
	    is_small);
	cache_bin_finish_flush_stashed(cache_bin);

	assert(cache_bin_nstashed_get_local(cache_bin) == 0);
	assert(cache_bin_ncached_get_local(cache_bin) == orig_cached);
	assert(head_content == *cache_bin->stack_head);
}